

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

void __thiscall soplex::SPxFastRT<double>::tighten(SPxFastRT<double> *this)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Tolerances *this_00;
  ulong uVar4;
  double dVar5;
  Real RVar6;
  double dVar7;
  
  peVar2 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  dVar5 = peVar2->s_epsilon_multiplier;
  uVar4 = -(ulong)(dVar5 == 1.0);
  dVar5 = (double)(~uVar4 & (ulong)(dVar5 * 1e-05) | uVar4 & 0x3ee4f8b588e368f1);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((this->super_SPxRatioTester<double>).delta + dVar5 <= this->fastDelta) {
    dVar7 = this->fastDelta - dVar5;
    this->fastDelta = dVar7;
    peVar2 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    dVar1 = peVar2->s_epsilon_multiplier;
    uVar4 = -(ulong)(dVar1 == 1.0);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((double)(~uVar4 & (ulong)(dVar1 * 0.0001) | uVar4 & 0x3f1a36e2eb1c432d) < dVar7) {
      this->fastDelta = this->fastDelta - (dVar5 + dVar5);
    }
  }
  dVar5 = this->minStab;
  peVar2 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  dVar7 = peVar2->s_epsilon_multiplier;
  uVar4 = -(ulong)(dVar7 == 1.0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (dVar5 < (double)(~uVar4 & (ulong)(dVar7 * 1e-05) | uVar4 & 0x3ee4f8b588e368f1)) {
    dVar5 = this->minStab / 0.9;
    this->minStab = dVar5;
    this_00 = (this->super_SPxRatioTester<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    RVar6 = Tolerances::floatingPointFeastol(this_00);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (dVar5 < RVar6) {
      this->minStab = this->minStab / 0.9;
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}